

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledOutputFile::updatePreviewImage(TiledOutputFile *this,PreviewRgba *newPixels)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  LogicExc *this_00;
  TypedAttribute<Imf_3_4::PreviewImage> *this_01;
  PreviewImage *this_02;
  PreviewRgba *pPVar6;
  undefined8 uVar7;
  long in_RSI;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  uint64_t savedPosition;
  int i;
  int numPixels;
  PreviewRgba *pixels;
  PreviewImage *pi;
  PreviewImageAttribute *pia;
  stringstream _iex_throw_s;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffc28;
  lock_guard<std::mutex> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc58;
  Header *in_stack_fffffffffffffc60;
  int local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [400];
  long local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  if (*(long *)(*(long *)(in_RDI + 8) + 0x80) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"Cannot update preview image pixels. File \"");
    pcVar5 = fileName((TiledOutputFile *)0x245df9);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\" does not contain a preview image.");
    this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_00,local_1b0);
    __cxa_throw(this_00,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  this_01 = Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>>
                      (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  this_02 = TypedAttribute<Imf_3_4::PreviewImage>::value(this_01);
  pPVar6 = PreviewImage::pixels(this_02);
  uVar2 = PreviewImage::width(this_02);
  uVar3 = PreviewImage::height(this_02);
  for (local_1d0 = 0; local_1d0 < (int)(uVar2 * uVar3); local_1d0 = local_1d0 + 1) {
    pPVar6[local_1d0] = *(PreviewRgba *)(local_10 + (long)local_1d0 * 4);
  }
  uVar7 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x10) + 0x28) + 0x18))();
  plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,*(undefined8 *)(*(long *)(in_RDI + 8) + 0x80));
  (*(this_01->super_Attribute)._vptr_Attribute[4])
            (this_01,*(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x28),
             (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x38));
  plVar1 = *(long **)(*(long *)(in_RDI + 0x10) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,uVar7);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24618b);
  return;
}

Assistant:

void
TiledOutputFile::updatePreviewImage (const PreviewRgba newPixels[])
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    if (_data->previewPosition <= 0)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Cannot update preview image pixels. "
            "File \""
                << fileName ()
                << "\" does not "
                   "contain a preview image.");

    //
    // Store the new pixels in the header's preview image attribute.
    //

    PreviewImageAttribute& pia =
        _data->header.typedAttribute<PreviewImageAttribute> ("preview");

    PreviewImage& pi        = pia.value ();
    PreviewRgba*  pixels    = pi.pixels ();
    int           numPixels = pi.width () * pi.height ();

    for (int i = 0; i < numPixels; ++i)
        pixels[i] = newPixels[i];

    //
    // Save the current file position, jump to the position in
    // the file where the preview image starts, store the new
    // preview image, and jump back to the saved file position.
    //

    uint64_t savedPosition = _streamData->os->tellp ();

    try
    {
        _streamData->os->seekp (_data->previewPosition);
        pia.writeValueTo (*_streamData->os, _data->version);
        _streamData->os->seekp (savedPosition);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Cannot update preview image pixels for "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}